

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_clearDict(dctx);
  if (ddict != (ZSTD_DDict *)0x0) {
    dctx->ddict = ddict;
    dctx->dictUses = ZSTD_use_indefinitely;
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong);
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
    }
    return 0;
}